

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<WhileStatementAstNode>_> * __thiscall
Parser::parseWhileStatement
          (optional<std::shared_ptr<WhileStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  undefined1 *puVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TokenType type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_a0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  size_type __dnew_2;
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  optional<std::shared_ptr<StatementAstNode>_> statement;
  byte local_29;
  bool error;
  
  local_29 = 0;
  puVar1 = (undefined1 *)
           ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8);
  __dnew_2 = 0x10;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = puVar1;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,(ulong)&__dnew_2);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)__dnew_2;
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected a while",0x10);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)__dnew_2
  ;
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ + __dnew_2) =
       '\0';
  type = (TokenType)this;
  expect((Parser *)local_a0,type,(bool *)0xf,(string *)&local_29);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if ((undefined1 *)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != puVar1) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  skipWhiteSpace(this);
  __dnew_2 = 0x21;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = puVar1;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,(ulong)&__dnew_2);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)__dnew_2;
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected a left paren after while",0x21);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)__dnew_2
  ;
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ + __dnew_2) =
       '\0';
  expect((Parser *)(local_a0 + 0x10),type,(bool *)0x5,(string *)&local_29);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if ((undefined1 *)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != puVar1) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)&__dnew_2,this);
  local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x30;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = puVar1;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,(ulong)&local_70);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_70._M_pi;
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected a right paren after expression of while",0x30);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70._M_pi;
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
           (long)local_70._M_pi) = '\0';
  expect((Parser *)local_80,type,(bool *)0x6,(string *)&local_29);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  if ((undefined1 *)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != puVar1) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)
                 &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,this)
  ;
  if (((local_29 == 0) &&
      (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
      ) && (local_29 = statement.
                       super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                       .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                       _8_1_ ^ 1,
           statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
           _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
           .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ ==
           '\x01')) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fe58;
    __gnu_cxx::new_allocator<WhileStatementAstNode>::
    construct<WhileStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&>
              ((new_allocator<WhileStatementAstNode> *)&local_70,
               (WhileStatementAstNode *)(p_Var3 + 1),(shared_ptr<ExpressionAstNode> *)&__dnew_2,
               (shared_ptr<StatementAstNode> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<WhileStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<WhileStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<WhileStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (WhileStatementAstNode *)(p_Var3 + 1);
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<WhileStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<WhileStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<WhileStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3
    ;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<WhileStatementAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<WhileStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_>._M_engaged = bVar2;
  if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01') {
    statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         ((ulong)statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi & 0xffffffffffffff00);
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
  {
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
    if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value.
        super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<WhileStatementAstNode>>
Parser::parseWhileStatement() noexcept {
  bool error = false;

  this->expect(TokenType::While, error, "Expected a while");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected a left paren after while");

  auto expression = this->parseExpression();

  this->expect(TokenType::RightParen, error, "Expected a right paren after expression of while");

  auto statement = this->parseStatement();

  error = error || !expression || !statement;

  if (error) { return std::nullopt; }

  return std::make_shared<WhileStatementAstNode>(expression.value(), statement.value());
}